

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::alter_palettes_for_miscolored_ground_items(World *world)

{
  Map *pMVar1;
  vector<Entity_*,_std::allocator<Entity_*>_> *pvVar2;
  const_reference ppEVar3;
  undefined1 local_12;
  undefined1 local_11;
  uint8_t i_1;
  uint8_t i;
  World *world_local;
  
  for (local_11 = 2; local_11 < 6; local_11 = local_11 + 1) {
    pMVar1 = World::map(world,0x234);
    pvVar2 = Map::entities(pMVar1);
    ppEVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(pvVar2,(ulong)local_11);
    Entity::palette(*ppEVar3,'\0');
  }
  pMVar1 = World::map(world,0x234);
  pvVar2 = Map::entities(pMVar1);
  ppEVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(pvVar2,0);
  Entity::palette(*ppEVar3,'\x01');
  pMVar1 = World::map(world,0x19f);
  pvVar2 = Map::entities(pMVar1);
  ppEVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(pvVar2,0);
  Entity::palette(*ppEVar3,'\0');
  for (local_12 = 1; local_12 < 3; local_12 = local_12 + 1) {
    pMVar1 = World::map(world,0x19f);
    pvVar2 = Map::entities(pMVar1);
    ppEVar3 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(pvVar2,(ulong)local_12);
    Entity::palette(*ppEVar3,'\x01');
  }
  return;
}

Assistant:

static void alter_palettes_for_miscolored_ground_items(World& world)
    {
        // Force trees to use environmental palette
        for(uint8_t i=2 ; i<=5 ; ++i)
            world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(i)->palette(0);
        // Put item back on its appropriate palette
        world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(0)->palette(1);

        // Force tree to use environmental palette
        world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(0)->palette(0);
        // Put items back on their appropriate palette
        for(uint8_t i=1 ; i<=2 ; ++i)
            world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(i)->palette(1);
    }